

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::following
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  uint uVar1;
  int iVar2;
  int32_t *piVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((fromPos < this->fLimit) && (this->fStart <= fromPos)) {
    uVar1 = (this->fBreaks).count;
    uVar4 = this->fPositionInCache;
    if ((int)uVar4 < (int)uVar1 && -1 < (int)uVar4) {
      piVar3 = (this->fBreaks).elements;
      if (piVar3[uVar4] == fromPos) {
        uVar4 = uVar4 + 1;
        this->fPositionInCache = uVar4;
        if (uVar4 < uVar1) {
          *result = piVar3[uVar4];
LAB_002ad9ff:
          *statusIndex = this->fOtherRuleStatusIndex;
          return '\x01';
        }
        goto LAB_002ad9f2;
      }
      this->fPositionInCache = 0;
    }
    else {
      this->fPositionInCache = 0;
      if ((int)uVar1 < 1) goto LAB_002ad9f2;
    }
    piVar3 = (this->fBreaks).elements;
    uVar5 = 0;
    do {
      iVar2 = piVar3[uVar5];
      if (fromPos < iVar2) {
        *result = iVar2;
        goto LAB_002ad9ff;
      }
      uVar5 = uVar5 + 1;
      this->fPositionInCache = (int32_t)uVar5;
    } while (uVar1 != uVar5);
  }
LAB_002ad9f2:
  this->fPositionInCache = -1;
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::following(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos >= fLimit || fromPos < fStart) {
        fPositionInCache = -1;
        return FALSE;
    }

    // Sequential iteration, move from previous boundary to the following

    int32_t r = 0;
    if (fPositionInCache >= 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        ++fPositionInCache;
        if (fPositionInCache >= fBreaks.size()) {
            fPositionInCache = -1;
            return FALSE;
        }
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r > fromPos);
        *result = r;
        *statusIndex = fOtherRuleStatusIndex;
        return TRUE;
    }

    // Random indexing. Linear search for the boundary following the given position.

    for (fPositionInCache = 0; fPositionInCache < fBreaks.size(); ++fPositionInCache) {
        r= fBreaks.elementAti(fPositionInCache);
        if (r > fromPos) {
            *result = r;
            *statusIndex = fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}